

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int tls_prf_generic(mbedtls_md_type_t md_type,uchar *secret,size_t slen,char *label,uchar *random,
                   size_t rlen,uchar *dstbuf,size_t dlen)

{
  ulong ilen;
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  size_t __n;
  long lVar3;
  ulong __n_00;
  ulong ilen_00;
  ulong uVar4;
  ulong uVar5;
  uchar *input;
  mbedtls_md_context_t md_ctx;
  uchar h_i [64];
  uchar tmp [128];
  mbedtls_md_context_t local_110;
  uchar local_f8 [64];
  uchar local_b8 [136];
  
  mbedtls_md_init(&local_110);
  md_info = mbedtls_md_info_from_type(md_type);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar2 = -0x6c00;
  }
  else {
    bVar1 = mbedtls_md_get_size(md_info);
    ilen_00 = (ulong)bVar1;
    __n = strlen(label);
    ilen = __n + rlen + ilen_00;
    iVar2 = -0x7100;
    if (ilen < 0x81) {
      input = local_b8 + ilen_00;
      memcpy(input,label,__n);
      memcpy(input + __n,random,rlen);
      iVar2 = mbedtls_md_setup(&local_110,md_info,1);
      if (iVar2 == 0) {
        mbedtls_md_hmac_starts(&local_110,secret,slen);
        mbedtls_md_hmac_update(&local_110,input,__n + rlen);
        mbedtls_md_hmac_finish(&local_110,local_b8);
        if (dlen != 0) {
          uVar4 = 0;
          do {
            mbedtls_md_hmac_reset(&local_110);
            mbedtls_md_hmac_update(&local_110,local_b8,ilen);
            mbedtls_md_hmac_finish(&local_110,local_f8);
            mbedtls_md_hmac_reset(&local_110);
            mbedtls_md_hmac_update(&local_110,local_b8,ilen_00);
            mbedtls_md_hmac_finish(&local_110,local_b8);
            uVar5 = uVar4 + ilen_00;
            __n_00 = ilen_00;
            if (dlen < uVar5) {
              __n_00 = dlen % ilen_00;
            }
            if (__n_00 != 0) {
              memcpy(dstbuf + uVar4,local_f8,__n_00);
            }
            uVar4 = uVar5;
          } while (uVar5 < dlen);
        }
        mbedtls_md_free(&local_110);
        lVar3 = 0;
        do {
          local_b8[lVar3] = '\0';
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x80);
        iVar2 = 0;
        lVar3 = 0;
        do {
          local_f8[lVar3] = '\0';
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x40);
      }
    }
  }
  return iVar2;
}

Assistant:

static int tls_prf_generic( mbedtls_md_type_t md_type,
                            const unsigned char *secret, size_t slen,
                            const char *label,
                            const unsigned char *random, size_t rlen,
                            unsigned char *dstbuf, size_t dlen )
{
    size_t nb;
    size_t i, j, k, md_len;
    unsigned char tmp[128];
    unsigned char h_i[MBEDTLS_MD_MAX_SIZE];
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    int ret;

    mbedtls_md_init( &md_ctx );

    if( ( md_info = mbedtls_md_info_from_type( md_type ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    md_len = mbedtls_md_get_size( md_info );

    if( sizeof( tmp ) < md_len + strlen( label ) + rlen )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    nb = strlen( label );
    memcpy( tmp + md_len, label, nb );
    memcpy( tmp + md_len + nb, random, rlen );
    nb += rlen;

    /*
     * Compute P_<hash>(secret, label + random)[0..dlen]
     */
    if ( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, secret, slen );
    mbedtls_md_hmac_update( &md_ctx, tmp + md_len, nb );
    mbedtls_md_hmac_finish( &md_ctx, tmp );

    for( i = 0; i < dlen; i += md_len )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, md_len + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, md_len );
        mbedtls_md_hmac_finish( &md_ctx, tmp );

        k = ( i + md_len > dlen ) ? dlen % md_len : md_len;

        for( j = 0; j < k; j++ )
            dstbuf[i + j]  = h_i[j];
    }

    mbedtls_md_free( &md_ctx );

    mbedtls_zeroize( tmp, sizeof( tmp ) );
    mbedtls_zeroize( h_i, sizeof( h_i ) );

    return( 0 );
}